

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O1

int Gia_ManSimBitPackOne
              (int nWords,Vec_Wrd_t *vSimsIn,Vec_Wrd_t *vSimsCare,int iPat,int *pLits,int nLits)

{
  word *pwVar1;
  word *pwVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  
  uVar4 = (ulong)(uint)nLits;
  uVar7 = 0;
  uVar8 = uVar7;
  if (0 < iPat) {
    do {
      uVar6 = 0;
      if (0 < nLits) {
        bVar5 = (byte)uVar7 & 0x3f;
        uVar10 = 0;
        do {
          uVar8 = pLits[uVar10];
          if ((int)uVar8 < 0) goto LAB_007b703c;
          uVar9 = (uVar8 >> 1) * nWords;
          if ((((int)uVar9 < 0) || (vSimsIn->nSize <= (int)uVar9)) ||
             (vSimsCare->nSize <= (int)uVar9)) goto LAB_007b701d;
        } while ((((vSimsCare->pArray[(ulong)uVar9 + (ulong)(uVar7 >> 6)] & 1L << bVar5) == 0) ||
                 (uVar6 = uVar10,
                 ((uVar8 ^ (uint)(vSimsIn->pArray[(ulong)uVar9 + (ulong)(uVar7 >> 6)] >> bVar5)) & 1
                 ) != 0)) && (uVar10 = uVar10 + 1, uVar6 = uVar4, uVar4 != uVar10));
      }
      uVar8 = uVar7;
    } while (((int)uVar6 != nLits) && (uVar7 = uVar7 + 1, uVar8 = iPat, uVar7 != iPat));
  }
  if (0 < nLits) {
    uVar10 = (ulong)(uVar8 >> 6);
    bVar5 = (byte)uVar8 & 0x3f;
    uVar6 = 1L << bVar5;
    uVar11 = 0;
    do {
      uVar7 = pLits[uVar11];
      if ((int)uVar7 < 0) {
LAB_007b703c:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar9 = (uVar7 >> 1) * nWords;
      if ((((int)uVar9 < 0) || (vSimsIn->nSize <= (int)uVar9)) || (vSimsCare->nSize <= (int)uVar9))
      {
LAB_007b701d:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      pwVar1 = vSimsIn->pArray;
      pwVar2 = vSimsCare->pArray;
      if (((pwVar2[uVar9 + uVar10] & uVar6) == 0) &&
         ((((uint)(pwVar1[uVar9 + uVar10] >> bVar5) ^ uVar7) & 1) == 0)) {
        pwVar1[uVar9 + uVar10] = pwVar1[uVar9 + uVar10] ^ uVar6;
      }
      uVar3 = pwVar2[uVar9 + uVar10];
      pwVar2[uVar9 + uVar10] = uVar3 | uVar6;
      if ((((uVar3 | uVar6) & uVar6) == 0) ||
         (((uVar7 ^ (uint)(pwVar1[uVar9 + uVar10] >> bVar5)) & 1) == 0)) {
        __assert_fail("Abc_TtGetBit(pSimsC, i) && (Abc_TtGetBit(pSimsI, i) != Abc_LitIsCompl(pLits[k]))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                      ,0xdc,
                      "int Gia_ManSimBitPackOne(int, Vec_Wrd_t *, Vec_Wrd_t *, int, int *, int)");
      }
      uVar11 = uVar11 + 1;
    } while (uVar4 != uVar11);
  }
  return (int)(uVar8 == iPat);
}

Assistant:

int Gia_ManSimBitPackOne( int nWords, Vec_Wrd_t * vSimsIn, Vec_Wrd_t * vSimsCare, int iPat, int * pLits, int nLits )
{
    word * pSimsI, * pSimsC; int i, k;
    for ( i = 0; i < iPat; i++ )
    {
        for ( k = 0; k < nLits; k++ )
        {
            int iVar = Abc_Lit2Var( pLits[k] );
            pSimsI = Vec_WrdEntryP( vSimsIn,   nWords * iVar );
            pSimsC = Vec_WrdEntryP( vSimsCare, nWords * iVar );
            if ( Abc_TtGetBit(pSimsC, i) && (Abc_TtGetBit(pSimsI, i) == Abc_LitIsCompl(pLits[k])) )
                break;
        }
        if ( k == nLits )
            break;
    }
    for ( k = 0; k < nLits; k++ )
    {
        int iVar = Abc_Lit2Var( pLits[k] );
        pSimsI = Vec_WrdEntryP( vSimsIn,   nWords * iVar );
        pSimsC = Vec_WrdEntryP( vSimsCare, nWords * iVar );
        if ( !Abc_TtGetBit(pSimsC, i) && Abc_TtGetBit(pSimsI, i) == Abc_LitIsCompl(pLits[k]) )
            Abc_TtXorBit( pSimsI, i );
        Abc_TtSetBit( pSimsC, i );
        assert( Abc_TtGetBit(pSimsC, i) && (Abc_TtGetBit(pSimsI, i) != Abc_LitIsCompl(pLits[k])) );
    }
    return (int)(i == iPat);
}